

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaDecompress.c
# Opt level: O3

UINT64 GetDecodedSizeOfBuf(UINT8 *EncodedData)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar2 = 0xd;
  uVar1 = 0;
  do {
    uVar1 = (ulong)EncodedData[uVar2 - 1] | uVar1 << 8;
    uVar2 = uVar2 - 1;
  } while (5 < uVar2);
  return uVar1;
}

Assistant:

UINT64
GetDecodedSizeOfBuf (
    UINT8 *EncodedData
    )
{
    UINT64 DecodedSize;
    INT32  Index;

    // Parse header
    DecodedSize = 0;
    for (Index = LZMA_PROPS_SIZE + 7; Index >= LZMA_PROPS_SIZE; Index--)
        DecodedSize = LShiftU64(DecodedSize, 8) + EncodedData[Index];

    return DecodedSize;
}